

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

RESULT_TYPE __thiscall
duckdb::QuantileComposed<duckdb::MadAccessor<long,_long,_long>,_duckdb::QuantileIndirect<long>_>::
operator()(QuantileComposed<duckdb::MadAccessor<long,_long,_long>,_duckdb::QuantileIndirect<long>_>
           *this,idx_t *input)

{
  INPUT_TYPE_conflict2 *input_00;
  RESULT_TYPE_conflict2 RVar1;
  MadAccessor<long,_long,_long> *in_RSI;
  undefined8 *in_RDI;
  INPUT_TYPE *in_stack_ffffffffffffffd8;
  
  input_00 = (INPUT_TYPE_conflict2 *)
             QuantileIndirect<long>::operator()
                       ((QuantileIndirect<long> *)*in_RDI,in_stack_ffffffffffffffd8);
  RVar1 = MadAccessor<long,_long,_long>::operator()(in_RSI,input_00);
  return RVar1;
}

Assistant:

inline RESULT_TYPE operator()(const idx_t &input) const {
		return outer(inner(input));
	}